

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_p.h
# Opt level: O3

uint8_t * chunkcopy_safe(uint8_t *out,uint8_t *from,uint64_t len,uint8_t *safe)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong __n;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  
  __n = (long)safe - (long)out;
  if (len <= (ulong)((long)safe - (long)out)) {
    __n = len;
  }
  uVar3 = (long)from - (long)out;
  puVar5 = out + __n;
  if ((from < out || puVar5 <= from) && (out < from || from + __n <= out)) {
    memcpy(out,from,__n);
  }
  else if (out != from) {
    puVar5 = out;
    uVar2 = -uVar3;
    if (0 < (long)uVar3) {
      uVar2 = uVar3;
    }
    for (; __n != 0; __n = __n - uVar4) {
      uVar3 = __n;
      uVar4 = __n;
      if (uVar2 < __n) {
        uVar3 = uVar2;
        uVar4 = uVar2;
      }
      for (; 0xf < uVar3; uVar3 = uVar3 - 0x10) {
        uVar1 = *(undefined8 *)(from + 8);
        *(undefined8 *)puVar5 = *(undefined8 *)from;
        *(undefined8 *)(puVar5 + 8) = uVar1;
        puVar5 = puVar5 + 0x10;
        from = from + 0x10;
      }
      if (7 < uVar3) {
        *(undefined8 *)puVar5 = *(undefined8 *)from;
        puVar5 = puVar5 + 8;
        from = from + 8;
        uVar3 = uVar3 - 8;
      }
      if (3 < uVar3) {
        *(undefined4 *)puVar5 = *(undefined4 *)from;
        puVar5 = puVar5 + 4;
        from = from + 4;
        uVar3 = uVar3 - 4;
      }
      for (; uVar3 != 0; uVar3 = uVar3 - 1) {
        *puVar5 = *from;
        from = from + 1;
        puVar5 = puVar5 + 1;
      }
    }
  }
  return puVar5;
}

Assistant:

static inline uint8_t* chunkcopy_safe(uint8_t *out, uint8_t *from, uint64_t len, uint8_t *safe) {
    uint64_t safelen = safe - out;
    len = MIN(len, safelen);
    int32_t olap_src = from >= out && from < out + len;
    int32_t olap_dst = out >= from && out < from + len;
    uint64_t tocopy;

    /* For all cases without overlap, memcpy is ideal */
    if (!(olap_src || olap_dst)) {
        memcpy(out, from, (size_t)len);
        return out + len;
    }

    /* Complete overlap: Source == destination */
    if (out == from) {
        return out + len;
    }

    /* We are emulating a self-modifying copy loop here. To do this in a way that doesn't produce undefined behavior,
     * we have to get a bit clever. First if the overlap is such that src falls between dst and dst+len, we can do the
     * initial bulk memcpy of the nonoverlapping region. Then, we can leverage the size of this to determine the safest
     * atomic memcpy size we can pick such that we have non-overlapping regions. This effectively becomes a safe look
     * behind or lookahead distance. */
    uint64_t non_olap_size = llabs(from - out); // llabs vs labs for compatibility with windows

    /* So this doesn't give use a worst case scenario of function calls in a loop,
     * we want to instead break this down into copy blocks of fixed lengths
     *
     * TODO: The memcpy calls aren't inlined on architectures with strict memory alignment
     */
    while (len) {
        tocopy = MIN(non_olap_size, len);
        len -= tocopy;

        while (tocopy >= 16) {
            memcpy(out, from, 16);
            out += 16;
            from += 16;
            tocopy -= 16;
        }

        if (tocopy >= 8) {
            memcpy(out, from, 8);
            out += 8;
            from += 8;
            tocopy -= 8;
        }

        if (tocopy >= 4) {
            memcpy(out, from, 4);
            out += 4;
            from += 4;
            tocopy -= 4;
        }

        while (tocopy--) {
            *out++ = *from++;
        }
    }

    return out;
}